

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O2

bool __thiscall cmGetPropertyCommand::HandleTargetMode(cmGetPropertyCommand *this)

{
  string *name;
  cmMakefile *this_00;
  bool bVar1;
  cmTarget *pcVar2;
  pointer value;
  ostream *poVar3;
  ostringstream e;
  string local_1b0;
  string local_190 [11];
  
  if ((this->Name)._M_string_length == 0) {
    std::__cxx11::string::string
              ((string *)local_190,"not given name for TARGET scope.",(allocator *)&local_1b0);
    cmCommand::SetError(&this->super_cmCommand,local_190);
    std::__cxx11::string::~string((string *)local_190);
LAB_002bd994:
    bVar1 = false;
  }
  else {
    name = &this->Name;
    bVar1 = std::operator==(&this->PropertyName,"ALIASED_TARGET");
    this_00 = (this->super_cmCommand).Makefile;
    if (bVar1) {
      bVar1 = cmMakefile::IsAlias(this_00,name);
      if (bVar1) {
        pcVar2 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,name,false);
        if (pcVar2 != (cmTarget *)0x0) {
          value = (pcVar2->Name)._M_dataplus._M_p;
          goto LAB_002bd8f6;
        }
      }
      std::operator+(local_190,&this->Variable,"-NOTFOUND");
      StoreResult(this,local_190[0]._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)local_190);
    }
    else {
      pcVar2 = cmMakefile::FindTargetToUse(this_00,name,false);
      if (pcVar2 == (cmTarget *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
        poVar3 = std::operator<<((ostream *)local_190,"could not find TARGET ");
        poVar3 = std::operator<<(poVar3,(string *)name);
        std::operator<<(poVar3,".  Perhaps it has not yet been created.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
        goto LAB_002bd994;
      }
      value = cmTarget::GetProperty(pcVar2,&this->PropertyName,(this->super_cmCommand).Makefile);
LAB_002bd8f6:
      StoreResult(this,value);
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool cmGetPropertyCommand::HandleTargetMode()
{
  if(this->Name.empty())
    {
    this->SetError("not given name for TARGET scope.");
    return false;
    }

  if(this->PropertyName == "ALIASED_TARGET")
    {
    if(this->Makefile->IsAlias(this->Name))
      {
      if(cmTarget* target =
                          this->Makefile->FindTargetToUse(this->Name))
        {
        return this->StoreResult(target->GetName().c_str());
        }
      }
    return this->StoreResult((this->Variable + "-NOTFOUND").c_str());
    }
  if(cmTarget* target = this->Makefile->FindTargetToUse(this->Name))
    {
    return this->StoreResult(target->GetProperty(this->PropertyName,
                                                 this->Makefile));
    }
  else
    {
    std::ostringstream e;
    e << "could not find TARGET " << this->Name
      << ".  Perhaps it has not yet been created.";
    this->SetError(e.str());
    return false;
    }
}